

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

I32 write_laszip_vlr_payload(laszip_dll_struct *laszip_dll,LASzip *laszip,ByteStreamOut *out)

{
  undefined2 local_3a;
  uint local_38;
  U16 type;
  U32 j;
  ByteStreamOut *local_28;
  ByteStreamOut *out_local;
  LASzip *laszip_local;
  laszip_dll_struct *laszip_dll_local;
  
  local_28 = out;
  out_local = (ByteStreamOut *)laszip;
  laszip_local = (LASzip *)laszip_dll;
  (*out->_vptr_ByteStreamOut[2])(out,&laszip->compressor);
  (*local_28->_vptr_ByteStreamOut[2])(local_28,(undefined1 *)((long)&out_local->bit_buffer + 2));
  (*local_28->_vptr_ByteStreamOut[1])(local_28,(undefined1 *)((long)&out_local->bit_buffer + 4),1);
  (*local_28->_vptr_ByteStreamOut[1])(local_28,(undefined1 *)((long)&out_local->bit_buffer + 5),1);
  (*local_28->_vptr_ByteStreamOut[2])(local_28,(undefined1 *)((long)&out_local->bit_buffer + 6));
  (*local_28->_vptr_ByteStreamOut[3])(local_28,&out_local->num_buffer);
  (*local_28->_vptr_ByteStreamOut[3])(local_28,&out_local->field_0x14);
  (*local_28->_vptr_ByteStreamOut[4])(local_28,out_local + 1);
  (*local_28->_vptr_ByteStreamOut[4])(local_28,&out_local[1].bit_buffer);
  (*local_28->_vptr_ByteStreamOut[2])(local_28,&out_local[1].num_buffer);
  for (local_38 = 0; local_38 < (ushort)out_local[1].num_buffer; local_38 = local_38 + 1) {
    local_3a = *(undefined2 *)(out_local[2]._vptr_ByteStreamOut + local_38);
    (*local_28->_vptr_ByteStreamOut[2])(local_28,&local_3a);
    (*local_28->_vptr_ByteStreamOut[2])
              (local_28,(long)out_local[2]._vptr_ByteStreamOut + (ulong)local_38 * 8 + 4);
    (*local_28->_vptr_ByteStreamOut[2])
              (local_28,(long)out_local[2]._vptr_ByteStreamOut + (ulong)local_38 * 8 + 6);
  }
  return 0;
}

Assistant:

static I32
write_laszip_vlr_payload(
    laszip_dll_struct*                 laszip_dll
    , const LASzip*                    laszip
    , ByteStreamOut*                   out
)
{
  // write the LASzip VLR payload

  //     U16  compressor                2 bytes
  //     U32  coder                     2 bytes
  //     U8   version_major             1 byte
  //     U8   version_minor             1 byte
  //     U16  version_revision          2 bytes
  //     U32  options                   4 bytes
  //     I32  chunk_size                4 bytes
  //     I64  number_of_special_evlrs   8 bytes
  //     I64  offset_to_special_evlrs   8 bytes
  //     U16  num_items                 2 bytes
  //        U16 type                2 bytes * num_items
  //        U16 size                2 bytes * num_items
  //        U16 version             2 bytes * num_items
  // which totals 34+6*num_items

  try { out->put16bitsLE((const U8*)&(laszip->compressor)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing compressor %d", (I32)laszip->compressor);
    return 1;
  }
  try { out->put16bitsLE((const U8*)&(laszip->coder)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing coder %d", (I32)laszip->coder);
    return 1;
  }
  try { out->putBytes((const U8*)&(laszip->version_major), 1); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing version_major %d", (I32)laszip->version_major);
    return 1;
  }
  try { out->putBytes((const U8*)&(laszip->version_minor), 1); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing version_minor %d", (I32)laszip->version_minor);
    return 1;
  }
  try { out->put16bitsLE((const U8*)&(laszip->version_revision)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing version_revision %d", (I32)laszip->version_revision);
    return 1;
  }
  try { out->put32bitsLE((const U8*)&(laszip->options)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing options %u", laszip->options);
    return 1;
  }
  try { out->put32bitsLE((const U8*)&(laszip->chunk_size)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing chunk_size %u", laszip->chunk_size);
    return 1;
  }
  try { out->put64bitsLE((const U8*)&(laszip->number_of_special_evlrs)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing number_of_special_evlrs %d", (I32)laszip->number_of_special_evlrs);
    return 1;
  }
  try { out->put64bitsLE((const U8*)&(laszip->offset_to_special_evlrs)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing offset_to_special_evlrs %d", (I32)laszip->offset_to_special_evlrs);
    return 1;
  }
  try { out->put16bitsLE((const U8*)&(laszip->num_items)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing num_items %d", (I32)laszip->num_items);
    return 1;
  }

  U32 j;
  for (j = 0; j < laszip->num_items; j++)
  {
    U16 type = (U16)(laszip->items[j].type);
    try { out->put16bitsLE((const U8*)&type); } catch(...)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing type %d of item %d", (I32)laszip->items[j].type, j);
      return 1;
    }
    try { out->put16bitsLE((const U8*)&(laszip->items[j].size)); } catch(...)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing size %d of item %d", (I32)laszip->items[j].size, j);
      return 1;
    }
    try { out->put16bitsLE((const U8*)&(laszip->items[j].version)); } catch(...)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing version %d of item %d", (I32)laszip->items[j].version, j);
      return 1;
    }
  }
  return 0;
}